

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

double * __thiscall Graph::getLosses(Graph *this)

{
  Vertex *pVVar1;
  Edge *pEVar2;
  double *pdVar3;
  Edge **ppEVar4;
  double dVar5;
  double dVar6;
  
  pdVar3 = (double *)operator_new__(0x10);
  dVar5 = 0.0;
  dVar6 = 0.0;
  *pdVar3 = 0.0;
  pdVar3[1] = 0.0;
  while (pVVar1 = this->verticesList, pVVar1 != (Vertex *)0x0) {
    ppEVar4 = &pVVar1->edgesList;
    while (pEVar2 = *ppEVar4, pEVar2 != (Edge *)0x0) {
      dVar5 = dVar5 + pEVar2->activeLoss;
      dVar6 = dVar6 + pEVar2->reactiveLoss;
      *pdVar3 = dVar5;
      pdVar3[1] = dVar6;
      ppEVar4 = &pEVar2->nextEdge;
    }
    this = (Graph *)&pVVar1->nextVertex;
  }
  return pdVar3;
}

Assistant:

double * Graph::getLosses(){
    double *loss = new double[2];
    loss[0] = 0.0;
    loss[1] = 0.0;
    for(Vertex *v=verticesList; v!=NULL; v = v->getNext()){
        for(Edge *e = v->getEdgesList(); e!=NULL; e = e->getNext()){
            loss[0] += e->getActiveLoss();
            loss[1] += e->getReactiveLoss();
        }
    }
    return loss;
}